

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          tag_t<cfgfile::qstring_trait_t> *parent,child_tags_list_t *list)

{
  pointer pptVar1;
  pointer pptVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  logic_error *this_00;
  bool bVar8;
  pointer pptVar9;
  lexeme_t<cfgfile::qstring_trait_t> lexeme;
  qstring_wrapper_t local_258;
  lexical_analyzer_t<cfgfile::qstring_trait_t> *local_238;
  tag_t<cfgfile::qstring_trait_t> *local_230;
  lexeme_t<cfgfile::qstring_trait_t> local_228;
  string local_208;
  string local_1e8;
  string_t local_1c8;
  string_t local_1b0;
  string_t local_198;
  string_t local_180;
  string_t local_168;
  string_t local_150;
  qstring_wrapper_t local_138;
  qstring_wrapper_t local_120;
  qstring_wrapper_t local_108;
  qstring_wrapper_t local_f0;
  qstring_wrapper_t local_d8;
  qstring_wrapper_t local_c0;
  qstring_wrapper_t local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_238 = &this->m_lex;
  local_230 = parent;
  lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(&local_228,local_238);
  pptVar1 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pptVar1 != pptVar2) {
    bVar8 = false;
    do {
      pptVar9 = pptVar1 + 1;
      bVar7 = start_tag_parsing(this,&local_228,*pptVar1);
      if (bVar7) {
        bVar8 = true;
      }
      pptVar1 = pptVar9;
    } while (pptVar9 != pptVar2 && !bVar7);
    if (bVar8) {
      if (&(local_228.m_value.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_228.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((local_228.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_228.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
            ._M_i == 0) {
          QArrayData::deallocate(&(local_228.m_value.m_str.d.d)->super_QArrayData,2,8);
        }
      }
      return;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Unexpected tag name. We expected one child tag of tag \"","");
  qstring_trait_t::from_ascii(&local_150,&local_50);
  operator+(&local_138,&local_150,&local_230->m_name);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\", but we\'ve got \"","");
  qstring_trait_t::from_ascii(&local_168,&local_70);
  operator+(&local_120,&local_138,&local_168);
  operator+(&local_108,&local_120,&local_228.m_value);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_180,&local_90);
  operator+(&local_f0,&local_108,&local_180);
  operator+(&local_d8,&local_f0,&local_238->m_stream->m_file_name);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"\" on line ","");
  qstring_trait_t::from_ascii(&local_198,&local_1e8);
  operator+(&local_c0,&local_d8,&local_198);
  qstring_trait_t::to_string(&local_1b0,(this->m_lex).m_line_number);
  operator+(&local_a8,&local_c0,&local_1b0);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,".","");
  qstring_trait_t::from_ascii(&local_1c8,&local_208);
  operator+(&local_258,&local_a8,&local_1c8);
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__exception_t_00131c80;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)(this_00 + 0x18) = 0;
  *(undefined8 *)(this_00 + 0x20) = 0;
  pcVar3 = *(char16_t **)(this_00 + 0x18);
  uVar5 = local_258.m_str.d.d._0_4_;
  uVar6 = local_258.m_str.d.d._4_4_;
  local_258.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this_00 + 0x10) = uVar5;
  *(undefined4 *)(this_00 + 0x14) = uVar6;
  *(undefined4 *)(this_00 + 0x18) = local_258.m_str.d.ptr._0_4_;
  *(undefined4 *)(this_00 + 0x1c) = local_258.m_str.d.ptr._4_4_;
  qVar4 = *(qsizetype *)(this_00 + 0x20);
  *(qsizetype *)(this_00 + 0x20) = local_258.m_str.d.size;
  local_258.m_str.d.ptr = pcVar3;
  local_258.m_str.d.size = qVar4;
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}